

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool __thiscall ON_NurbsCurve::Trim(ON_NurbsCurve *this,ON_Interval *in)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ON_Interval *this_00;
  bool bVar4;
  double *pdVar5;
  ON_Interval local_60;
  int local_50;
  int local_4c;
  int new_cv_count;
  int i1_max;
  int i1;
  int i0;
  int side;
  int ki;
  double split_t;
  double t;
  int order;
  int cv_dim;
  ON_Interval *in_local;
  ON_NurbsCurve *this_local;
  
  _order = in;
  in_local = (ON_Interval *)this;
  bVar4 = ON_Interval::IsIncreasing(in);
  if (bVar4) {
    t._4_4_ = CVSize(this);
    t._0_4_ = Order(this);
    this_00 = _order;
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
    bVar4 = ON_Interval::operator==(this_00,&local_60);
    if (bVar4) {
      this_local._7_1_ = true;
    }
    else {
      ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
      i1 = -1;
      split_t = _order->m_t[1];
      i0 = ON_NurbsSpanIndex(t._0_4_,this->m_cv_count,this->m_knot,split_t,-1,0);
      _side = split_t;
      bVar4 = TweakSplitTrimParameter
                        (this->m_knot[i0 + t._0_4_ + -2],this->m_knot[i0 + t._0_4_ + -1],
                         (double *)&side);
      if (bVar4) {
        i0 = ON_NurbsSpanIndex(t._0_4_,this->m_cv_count,this->m_knot,_side,i1,i0);
      }
      iVar3 = t._4_4_;
      iVar2 = t._0_4_;
      iVar1 = this->m_cv_stride;
      pdVar5 = CV(this,i0);
      bVar4 = ON_EvaluateNurbsDeBoor(iVar3,iVar2,iVar1,pdVar5,this->m_knot + i0,i1,0.0,split_t);
      if (bVar4) {
        this->m_cv_count = i0 + t._0_4_;
        i1_max = ON_KnotCount(t._0_4_,this->m_cv_count);
        while (i1_max = i1_max + -1, this->m_cv_count + -1 <= i1_max) {
          this->m_knot[i1_max] = split_t;
        }
        i1 = 1;
        split_t = _order->m_t[0];
        i0 = ON_NurbsSpanIndex(t._0_4_,this->m_cv_count,this->m_knot,split_t,1,0);
        _side = split_t;
        bVar4 = TweakSplitTrimParameter
                          (this->m_knot[i0 + t._0_4_ + -2],this->m_knot[i0 + t._0_4_ + -1],
                           (double *)&side);
        if (bVar4) {
          i0 = ON_NurbsSpanIndex(t._0_4_,this->m_cv_count,this->m_knot,_side,i1,i0);
        }
        iVar3 = t._4_4_;
        iVar2 = t._0_4_;
        iVar1 = this->m_cv_stride;
        pdVar5 = CV(this,i0);
        bVar4 = ON_EvaluateNurbsDeBoor(iVar3,iVar2,iVar1,pdVar5,this->m_knot + i0,i1,0.0,split_t);
        if (bVar4) {
          local_50 = this->m_cv_count - i0;
          if (local_50 < this->m_cv_count) {
            local_4c = this->m_cv_stride * this->m_cv_count;
            i1_max = 0;
            for (new_cv_count = i0 * this->m_cv_stride; new_cv_count < local_4c;
                new_cv_count = new_cv_count + 1) {
              this->m_cv[i1_max] = this->m_cv[new_cv_count];
              i1_max = i1_max + 1;
            }
            local_4c = ON_KnotCount(t._0_4_,this->m_cv_count);
            i1_max = 0;
            for (new_cv_count = i0; new_cv_count < local_4c; new_cv_count = new_cv_count + 1) {
              this->m_knot[i1_max] = this->m_knot[new_cv_count];
              i1_max = i1_max + 1;
            }
            this->m_cv_count = local_50;
          }
          for (i1_max = 0; i1_max <= t._0_4_ + -2; i1_max = i1_max + 1) {
            this->m_knot[i1_max] = split_t;
          }
          ClampEnd(this,2);
          ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
          this_local._7_1_ = true;
        }
        else {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbscurve.cpp"
                     ,0xbec,"","ON_NurbsCurve::Trim() - right end de Boor algorithm failed.");
          this_local._7_1_ = false;
        }
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbscurve.cpp"
                   ,0xbd7,"","ON_NurbsCurve::Trim() - right end de Boor algorithm failed.");
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_NurbsCurve::Trim( const ON_Interval& in )
{
  if ( !in.IsIncreasing() )
    return false;

  const int cv_dim = CVSize();
  const int order = Order();
  double t, split_t;
  int ki, side, i0, i1, i1_max, new_cv_count;

	//Greg Arden 28 April 2003.  Do not change any curve that is trimmed to its entire domain.
	//             This is especially important for periodic curves.
	if(in==Domain())
	  return true;


  DestroyCurveTree();

  // cut off right end (or extend if in.m_t[1] > Domain.Max()
  side = -1;
  t = in.m_t[1]; // trimming parameter
  ki = ON_NurbsSpanIndex( order, m_cv_count, m_knot, t, side, 0 );

  // if t is very close to a knot value, then trim at the knot
  split_t = t;
  if ( TweakSplitTrimParameter(m_knot[ki+order-2], m_knot[ki+order-1], split_t ) )
    ki = ON_NurbsSpanIndex( order, m_cv_count, m_knot, split_t, side, ki );

  if ( !ON_EvaluateNurbsDeBoor( cv_dim, order, m_cv_stride, CV(ki),
                                m_knot + ki, side, 0.0, t ) ) 
  {
    ON_ERROR("ON_NurbsCurve::Trim() - right end de Boor algorithm failed.");
    return false;
  }
  // clamp right end knots
  m_cv_count = ki + order;
  for ( i0 = ON_KnotCount( order, m_cv_count)-1; i0 >= m_cv_count-1; i0--)
    m_knot[i0] = t;

  // cut off left end (or extend if in.m_t[0] < Domain.Max()
  side = 1;
  t = in.m_t[0]; // trimming parameter
  ki = ON_NurbsSpanIndex( order, m_cv_count, m_knot, t, side, 0 );

  // if t is very close to a knot value, then trim at the knot
  split_t = t;
  if (TweakSplitTrimParameter(m_knot[ki + order - 2], m_knot[ki + order - 1], split_t))
    ki = ON_NurbsSpanIndex( order, m_cv_count, m_knot, split_t, side, ki );

  if ( !ON_EvaluateNurbsDeBoor( cv_dim, order, m_cv_stride, CV(ki),
                                m_knot + ki, side, 0.0, t ) ) 
  {
    ON_ERROR("ON_NurbsCurve::Trim() - right end de Boor algorithm failed.");
    return false;
  }

  // remove surplus cvs and knots
  new_cv_count = m_cv_count - ki;
  if ( new_cv_count < m_cv_count ) {
    // move cvs and knots over
    i1_max = m_cv_stride*m_cv_count;
    for ( i0 = 0, i1 = ki*m_cv_stride; i1 < i1_max; i0++, i1++ )
      m_cv[i0] = m_cv[i1];
    i1_max = ON_KnotCount( order, m_cv_count );
    for ( i0 = 0, i1 = ki; i1 < i1_max; i0++, i1++ )
      m_knot[i0] = m_knot[i1];
    m_cv_count = new_cv_count;
  }

  // clamp left end knots
  for (i0 = 0; i0 <= order-2; i0++)
    m_knot[i0] = t;

  ClampEnd(2); // 26 June 2003 Dale Lear

	DestroyCurveTree();
  return true;
}